

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O2

int __thiscall cmCPackRPMGenerator::PackageFiles(cmCPackRPMGenerator *this)

{
  ComponentPackageMethod CVar1;
  cmCPackLog *this_00;
  int iVar2;
  ostream *poVar3;
  char *local_1a8 [4];
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"Toplevel: ");
  poVar3 = std::operator<<(poVar3,(string *)&(this->super_cmCPackGenerator).toplevel);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(this_00,4,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                  ,0x189,local_1a8[0]);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  iVar2 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x17])(this);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)&cmCPackLog_msg,"",(allocator *)local_1a8);
    iVar2 = PackageComponentsAllInOne(this,(string *)&cmCPackLog_msg);
  }
  else {
    CVar1 = (this->super_cmCPackGenerator).componentPackageMethod;
    if (CVar1 != ONE_PACKAGE) {
      iVar2 = PackageComponents(this,CVar1 == ONE_PACKAGE_PER_COMPONENT);
      return iVar2;
    }
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"ALL_COMPONENTS_IN_ONE",(allocator *)local_1a8);
    iVar2 = PackageComponentsAllInOne(this,(string *)&cmCPackLog_msg);
  }
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  return iVar2;
}

Assistant:

int cmCPackRPMGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Toplevel: " << toplevel << std::endl);

  /* Are we in the component packaging case */
  if (WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (componentPackageMethod == ONE_PACKAGE) {
      return PackageComponentsAllInOne("ALL_COMPONENTS_IN_ONE");
    }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    return PackageComponents(componentPackageMethod ==
                             ONE_PACKAGE_PER_COMPONENT);
  }
  // CASE 3 : NON COMPONENT package.
  return PackageComponentsAllInOne("");
}